

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O3

bool __thiscall
chaiscript::detail::Dispatch_Function::operator==(Dispatch_Function *this,Proxy_Function_Base *rhs)

{
  pointer psVar1;
  pointer psVar2;
  pointer psVar3;
  _func_int **pp_Var4;
  bool bVar5;
  
  if (rhs->_vptr_Proxy_Function_Base != (_func_int **)&PTR__Dispatch_Function_003bb9d0) {
    __cxa_bad_cast();
  }
  psVar1 = (this->m_funcs).
           super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (this->m_funcs).
           super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pp_Var4 = rhs[1]._vptr_Proxy_Function_Base;
  if ((long)psVar2 - (long)psVar1 ==
      (long)rhs[1].m_types.
            super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
            _M_impl.super__Vector_impl_data._M_start - (long)pp_Var4) {
    if (psVar1 == psVar2) {
      bVar5 = true;
    }
    else {
      do {
        psVar3 = psVar1 + 1;
        bVar5 = (psVar1->
                super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr == (element_type *)*pp_Var4;
        if (!bVar5) {
          return bVar5;
        }
        pp_Var4 = pp_Var4 + 2;
        psVar1 = psVar3;
      } while (psVar3 != psVar2);
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool operator==(const dispatch::Proxy_Function_Base &rhs) const noexcept override {
        try {
          const auto &dispatch_fun = dynamic_cast<const Dispatch_Function &>(rhs);
          return m_funcs == dispatch_fun.m_funcs;
        } catch (const std::bad_cast &) {
          return false;
        }
      }